

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void anon_unknown.dwarf_1ccb39::AddKnownTx(Peer *peer,uint256 *hash)

{
  long lVar1;
  TxRelay *pTVar2;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar2 = Peer::GetTxRelay(peer);
  if (pTVar2 != (TxRelay *)0x0) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock22,&pTVar2->m_tx_inventory_mutex,"tx_relay->m_tx_inventory_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
               ,0x4ec,false);
    vKey.m_size = 0x20;
    vKey.m_data = (uchar *)hash;
    CRollingBloomFilter::insert(&pTVar2->m_tx_inventory_known_filter,vKey);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock22.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void AddKnownTx(Peer& peer, const uint256& hash)
{
    auto tx_relay = peer.GetTxRelay();
    if (!tx_relay) return;

    LOCK(tx_relay->m_tx_inventory_mutex);
    tx_relay->m_tx_inventory_known_filter.insert(hash);
}